

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int nonce_function_bip340
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *xonly_pk32,uchar *algo16,void *data)

{
  int iVar1;
  bool bVar2;
  int local_d0;
  int local_cc;
  int algo16_len;
  int i;
  uchar masked_key [32];
  secp256k1_sha256 sha;
  void *data_local;
  uchar *algo16_local;
  uchar *xonly_pk32_local;
  uchar *key32_local;
  uchar *msg32_local;
  uchar *nonce32_local;
  
  if (algo16 == (uchar *)0x0) {
    nonce32_local._4_4_ = 0;
  }
  else {
    if (data != (void *)0x0) {
      secp256k1_nonce_function_bip340_sha256_tagged_aux((secp256k1_sha256 *)(masked_key + 0x18));
      secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),(uchar *)data,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)(masked_key + 0x18),(uchar *)&algo16_len);
      for (local_cc = 0; local_cc < 0x20; local_cc = local_cc + 1) {
        *(byte *)((long)&algo16_len + (long)local_cc) =
             *(byte *)((long)&algo16_len + (long)local_cc) ^ key32[local_cc];
      }
    }
    iVar1 = secp256k1_memcmp_var(algo16,"BIP0340/nonce",0x10);
    if (iVar1 == 0) {
      secp256k1_nonce_function_bip340_sha256_tagged((secp256k1_sha256 *)(masked_key + 0x18));
    }
    else {
      local_d0 = 0x10;
      while( true ) {
        bVar2 = false;
        if (0 < local_d0) {
          bVar2 = algo16[local_d0 + -1] == '\0';
        }
        if (!bVar2) break;
        local_d0 = local_d0 + -1;
      }
      secp256k1_sha256_initialize_tagged
                ((secp256k1_sha256 *)(masked_key + 0x18),algo16,(long)local_d0);
    }
    if (data == (void *)0x0) {
      secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),key32,0x20);
    }
    else {
      secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),(uchar *)&algo16_len,0x20);
    }
    secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),xonly_pk32,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)(masked_key + 0x18),msg32,0x20);
    secp256k1_sha256_finalize((secp256k1_sha256 *)(masked_key + 0x18),nonce32);
    nonce32_local._4_4_ = 1;
  }
  return nonce32_local._4_4_;
}

Assistant:

static int nonce_function_bip340(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo16, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo16 == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    }

    /* Tag the hash with algo16 which is important to avoid nonce reuse across
     * algorithms. If this nonce function is used in BIP-340 signing as defined
     * in the spec, an optimized tagging implementation is used. */
    if (secp256k1_memcmp_var(algo16, bip340_algo16, 16) == 0) {
        secp256k1_nonce_function_bip340_sha256_tagged(&sha);
    } else {
        int algo16_len = 16;
        /* Remove terminating null bytes */
        while (algo16_len > 0 && !algo16[algo16_len - 1]) {
            algo16_len--;
        }
        secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len);
    }

    /* Hash (masked-)key||pk||msg using the tagged hash as per the spec */
    if (data != NULL) {
        secp256k1_sha256_write(&sha, masked_key, 32);
    } else {
        secp256k1_sha256_write(&sha, key32, 32);
    }
    secp256k1_sha256_write(&sha, xonly_pk32, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}